

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O0

void __thiscall
icu_63::ICUBreakIteratorService::ICUBreakIteratorService(ICUBreakIteratorService *this)

{
  ICUBreakIteratorFactory *this_00;
  UnicodeString *dname;
  ICUBreakIteratorFactory *local_90;
  undefined4 local_68 [2];
  UErrorCode status;
  ConstChar16Ptr local_58;
  UnicodeString local_50;
  ICUBreakIteratorService *local_10;
  ICUBreakIteratorService *this_local;
  
  local_10 = this;
  ConstChar16Ptr::ConstChar16Ptr(&local_58,L"Break Iterator");
  UnicodeString::UnicodeString(&local_50,'\x01',&local_58,0xe);
  dname = &local_50;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString(&local_50);
  ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUBreakIteratorService_004f2350;
  local_68[0] = 0;
  this_00 = (ICUBreakIteratorFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  local_90 = (ICUBreakIteratorFactory *)0x0;
  if (this_00 != (ICUBreakIteratorFactory *)0x0) {
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x28) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x30) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x18) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x20) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 8) = 0;
    (this_00->super_ICUResourceBundleFactory)._bundleName.fUnion.fFields.fArray = (char16_t *)0x0;
    (this_00->super_ICUResourceBundleFactory)._bundleName.super_Replaceable.super_UObject.
    _vptr_UObject = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion = 0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x30) =
         0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._coverage = 0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x20) =
         0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x28) =
         0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion.fFields.fArray =
         (char16_t *)0x0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x18) =
         0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion =
         0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 8) = 0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory.super_ICUServiceFactory.
    super_UObject._vptr_UObject = (_func_int **)0x0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.super_Replaceable.
    super_UObject._vptr_UObject = (_func_int **)0x0;
    ICUBreakIteratorFactory::ICUBreakIteratorFactory(this_00);
    local_90 = this_00;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,local_90,local_68);
  return;
}

Assistant:

ICUBreakIteratorService()
        : ICULocaleService(UNICODE_STRING("Break Iterator", 14))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUBreakIteratorFactory(), status);
    }